

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * __thiscall
CLI::Formatter::make_usage(string *__return_storage_ptr__,Formatter *this,App *app,string *name)

{
  char cVar1;
  bool bVar2;
  ostream *poVar3;
  size_type __n;
  size_t sVar4;
  string *psVar5;
  char *pcVar6;
  allocator local_3f9;
  string local_3f8;
  string local_3d8;
  anon_class_1_0_00000001 local_3b1;
  function<bool_(const_CLI::App_*)> local_3b0;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> local_390;
  allocator local_371;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_370;
  string local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_330;
  Formatter *local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_320;
  __normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
  local_318;
  __normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
  local_310;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_301;
  undefined1 local_300 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  positional_names;
  function<bool_(const_CLI::Option_*)> local_2e0;
  undefined1 local_2c0 [8];
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> positionals;
  string local_2a0;
  string local_280;
  anon_class_1_0_00000001 local_259;
  function<bool_(const_CLI::Option_*)> local_258;
  undefined1 local_238 [8];
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> non_pos_options;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groups;
  allocator local_1f1;
  string local_1f0;
  string local_1d0;
  stringstream local_1b0 [8];
  stringstream out;
  ostream local_1a0 [376];
  string *local_28;
  string *name_local;
  App *app_local;
  Formatter *this_local;
  
  local_28 = name;
  name_local = (string *)app;
  app_local = (App *)this;
  this_local = (Formatter *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b0);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_1f0,"Usage",&local_1f1);
  FormatterBase::get_label(&local_1d0,&this->super_FormatterBase,&local_1f0);
  poVar3 = ::std::operator<<(local_1a0,(string *)&local_1d0);
  poVar3 = ::std::operator<<(poVar3,":");
  cVar1 = ::std::__cxx11::string::empty();
  pcVar6 = "\n  ";
  if (cVar1 != '\0') {
    pcVar6 = "\n\n";
  }
  poVar3 = ::std::operator<<(poVar3,pcVar6 + 2);
  ::std::operator<<(poVar3,(string *)name);
  ::std::__cxx11::string::~string((string *)&local_1d0);
  ::std::__cxx11::string::~string((string *)&local_1f0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  App::get_groups_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&non_pos_options.
                 super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage,(App *)name_local);
  psVar5 = name_local;
  ::std::function<bool(CLI::Option_const*)>::
  function<CLI::Formatter::make_usage(CLI::App_const*,std::__cxx11::string)const::_lambda(CLI::Option_const*)_1_,void>
            ((function<bool(CLI::Option_const*)> *)&local_258,&local_259);
  App::get_options((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)local_238,
                   (App *)psVar5,&local_258);
  std::function<bool_(const_CLI::Option_*)>::~function(&local_258);
  bVar2 = std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::empty
                    ((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)local_238)
  ;
  if (!bVar2) {
    poVar3 = ::std::operator<<(local_1a0," [");
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_2a0,"OPTIONS",
               (allocator *)
               ((long)&positionals.
                       super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    FormatterBase::get_label(&local_280,&this->super_FormatterBase,&local_2a0);
    poVar3 = ::std::operator<<(poVar3,(string *)&local_280);
    ::std::operator<<(poVar3,"]");
    ::std::__cxx11::string::~string((string *)&local_280);
    ::std::__cxx11::string::~string((string *)&local_2a0);
    ::std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&positionals.
                       super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  }
  psVar5 = name_local;
  ::std::function<bool(CLI::Option_const*)>::
  function<CLI::Formatter::make_usage(CLI::App_const*,std::__cxx11::string)const::_lambda(CLI::Option_const*)_2_,void>
            ((function<bool(CLI::Option_const*)> *)&local_2e0,
             (anon_class_1_0_00000001 *)
             ((long)&positional_names.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  App::get_options((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)local_2c0,
                   (App *)psVar5,&local_2e0);
  std::function<bool_(const_CLI::Option_*)>::~function(&local_2e0);
  bVar2 = std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::empty
                    ((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)local_2c0)
  ;
  if (!bVar2) {
    __n = std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::size
                    ((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)local_2c0)
    ;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_301);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_300,__n,&local_301);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_301);
    local_310._M_current =
         (Option **)
         std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::begin
                   ((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)local_2c0);
    local_318._M_current =
         (Option **)
         std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::end
                   ((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)local_2c0);
    local_320 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_300);
    psVar5 = (string *)this;
    local_328 = this;
    local_330 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ::std::
                transform<__gnu_cxx::__normal_iterator<CLI::Option_const**,std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,CLI::Formatter::make_usage(CLI::App_const*,std::__cxx11::string)const::_lambda(CLI::Option_const*)_3_>
                          (local_310,local_318,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )local_320,(anon_class_8_1_8991fb9c)this);
    poVar3 = ::std::operator<<(local_1a0," ");
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_370," ",&local_371);
    detail::join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_350,(detail *)local_300,&local_370,psVar5);
    ::std::operator<<(poVar3,(string *)&local_350);
    ::std::__cxx11::string::~string((string *)&local_350);
    ::std::__cxx11::string::~string((string *)&local_370);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_371);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_300);
  }
  psVar5 = name_local;
  ::std::function<bool(CLI::App_const*)>::
  function<CLI::Formatter::make_usage(CLI::App_const*,std::__cxx11::string)const::_lambda(CLI::App_const*)_1_,void>
            ((function<bool(CLI::App_const*)> *)&local_3b0,&local_3b1);
  App::get_subcommands(&local_390,(App *)psVar5,&local_3b0);
  bVar2 = std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::empty(&local_390);
  std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::~vector(&local_390);
  std::function<bool_(const_CLI::App_*)>::~function(&local_3b0);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    poVar3 = ::std::operator<<(local_1a0," ");
    sVar4 = App::get_require_subcommand_min((App *)name_local);
    pcVar6 = "";
    if (sVar4 == 0) {
      pcVar6 = "[";
    }
    poVar3 = ::std::operator<<(poVar3,pcVar6);
    sVar4 = App::get_require_subcommand_max((App *)name_local);
    bVar2 = true;
    if (1 < sVar4) {
      sVar4 = App::get_require_subcommand_min((App *)name_local);
      bVar2 = 1 < sVar4;
    }
    pcVar6 = "SUBCOMMANDS";
    if (bVar2) {
      pcVar6 = "SUBCOMMAND";
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_3f8,pcVar6,&local_3f9);
    FormatterBase::get_label(&local_3d8,&this->super_FormatterBase,&local_3f8);
    poVar3 = ::std::operator<<(poVar3,(string *)&local_3d8);
    sVar4 = App::get_require_subcommand_min((App *)name_local);
    pcVar6 = "";
    if (sVar4 == 0) {
      pcVar6 = "]";
    }
    ::std::operator<<(poVar3,pcVar6);
    ::std::__cxx11::string::~string((string *)&local_3d8);
    ::std::__cxx11::string::~string((string *)&local_3f8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
  }
  ::std::ostream::operator<<(local_1a0,::std::endl<char,std::char_traits<char>>);
  ::std::__cxx11::stringstream::str();
  std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::~vector
            ((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)local_2c0);
  std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::~vector
            ((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)local_238);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&non_pos_options.
                super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  ::std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

inline std::string Formatter::make_usage(const App *app, std::string name) const {
    std::stringstream out;

    out << get_label("Usage") << ":" << (name.empty() ? "" : " ") << name;

    std::vector<std::string> groups = app->get_groups();

    // Print an Options badge if any options exist
    std::vector<const Option *> non_pos_options =
        app->get_options([](const Option *opt) { return opt->nonpositional(); });
    if(!non_pos_options.empty())
        out << " [" << get_label("OPTIONS") << "]";

    // Positionals need to be listed here
    std::vector<const Option *> positionals = app->get_options([](const Option *opt) { return opt->get_positional(); });

    // Print out positionals if any are left
    if(!positionals.empty()) {
        // Convert to help names
        std::vector<std::string> positional_names(positionals.size());
        std::transform(positionals.begin(), positionals.end(), positional_names.begin(), [this](const Option *opt) {
            return make_option_usage(opt);
        });

        out << " " << detail::join(positional_names, " ");
    }

    // Add a marker if subcommands are expected or optional
    if(!app->get_subcommands(
               [](const CLI::App *subc) { return ((!subc->get_disabled()) && (!subc->get_name().empty())); })
            .empty()) {
        out << " " << (app->get_require_subcommand_min() == 0 ? "[" : "")
            << get_label(app->get_require_subcommand_max() < 2 || app->get_require_subcommand_min() > 1 ? "SUBCOMMAND"
                                                                                                        : "SUBCOMMANDS")
            << (app->get_require_subcommand_min() == 0 ? "]" : "");
    }

    out << std::endl;

    return out.str();
}